

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O0

void __thiscall fasttext::QMatrix::quantizeNorm(QMatrix *this,Vector *norms)

{
  unsigned_long uVar1;
  real *x;
  pointer codes;
  ProductQuantizer *in_RDI;
  real *dataptr;
  real *in_stack_00000100;
  int32_t in_stack_0000010c;
  ProductQuantizer *in_stack_00000110;
  int32_t in_stack_ffffffffffffffcc;
  
  if (((ulong)(in_RDI->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    __assert_fail("qnorm_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                  ,0x21,"void fasttext::QMatrix::quantizeNorm(const Vector &)");
  }
  uVar1 = Vector::size((Vector *)0x182539);
  if (uVar1 == (in_RDI->rng)._M_x) {
    x = Vector::data((Vector *)0x18256f);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                *)0x182582);
    ProductQuantizer::train(in_stack_00000110,in_stack_0000010c,in_stack_00000100);
    codes = std::
            unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
            ::operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                          *)0x1825a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1825c5);
    ProductQuantizer::compute_codes(in_RDI,x,(uint8_t *)codes,in_stack_ffffffffffffffcc);
    return;
  }
  __assert_fail("norms.size() == m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                ,0x22,"void fasttext::QMatrix::quantizeNorm(const Vector &)");
}

Assistant:

void QMatrix::quantizeNorm(const Vector& norms) {
  assert(qnorm_);
  assert(norms.size() == m_);
  auto dataptr = norms.data();
  npq_->train(m_, dataptr);
  npq_->compute_codes(dataptr, norm_codes_.data(), m_);
}